

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lyd_parser_notif_eventtime_validate(lyd_node *node)

{
  ly_ctx *ctx;
  lysp_tpdf *plVar1;
  lysp_restr *patterns_p;
  ly_ctx *ctx_00;
  uint __line;
  lysc_pattern **patterns_00;
  lysp_tpdf *plVar2;
  int iVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  ulong uVar8;
  lysc_node *schema;
  char *pcVar9;
  size_t sVar10;
  lysp_tpdf *plVar11;
  long lVar12;
  uint64_t c__;
  ulong uVar13;
  lysc_pattern *plVar14;
  lysc_pattern **patterns;
  ly_err_item *err;
  lysc_ctx cctx;
  
  if (node->schema == (lysc_node *)0x0) {
    plVar6 = (lys_module *)&node[2].schema;
  }
  else {
    plVar6 = node->schema->module;
  }
  ctx = plVar6->ctx;
  memset(&cctx,0,0x10a0);
  err = (ly_err_item *)0x0;
  patterns = (lysc_pattern **)0x0;
  plVar6 = ly_ctx_get_module_implemented(ctx,"notifications");
  plVar7 = ly_ctx_get_module_latest(ctx,"ietf-yang-types");
  if (plVar7 == (lys_module *)0x0) {
    pcVar9 = "mod2";
    __line = 0x57;
LAB_00161043:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,__line,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
  }
  if ((plVar6 == (lys_module *)0x0) && (plVar7->parsed != (lysp_module *)0x0)) {
    cctx.path_len = 1;
    cctx.path[0] = '/';
    plVar1 = plVar7->parsed->typedefs;
    uVar13 = 0xffffffffffffffff;
    plVar2 = plVar1;
    cctx.ctx = ctx;
    cctx.free_ctx.ctx = ctx;
    do {
      plVar11 = plVar2;
      if (plVar1 == (lysp_tpdf *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ulong *)&plVar1[-1].flags;
      }
      uVar13 = uVar13 + 1;
      if (uVar8 <= uVar13) {
        pcVar9 = "type_p";
        __line = 0x6b;
        goto LAB_00161043;
      }
      iVar3 = strcmp(plVar11->name,"date-and-time");
      plVar2 = plVar11 + 1;
    } while (iVar3 != 0);
    patterns_p = (plVar11->type).patterns;
    if (patterns_p == (lysp_restr *)0x0) {
      pcVar9 = "type_p->patterns";
      __line = 0x6e;
      goto LAB_00161043;
    }
    LVar4 = lys_compile_type_patterns(&cctx,patterns_p,(lysc_pattern **)0x0,&patterns);
    if (LVar4 == LY_SUCCESS) {
      pcVar9 = lyd_get_value(node);
      patterns_00 = patterns;
      sVar10 = strlen(pcVar9);
      LVar4 = lyplg_type_validate_patterns(patterns_00,pcVar9,sVar10,&err);
    }
  }
  else {
    if (node->schema == (lysc_node *)0x0) {
      plVar6 = (lys_module *)&node[2].schema;
    }
    else {
      plVar6 = node->schema->module;
    }
    schema = lys_find_path(plVar6->ctx,(lysc_node *)0x0,"/notifications:notification/eventTime",'\0'
                          );
    if (schema == (lysc_node *)0x0) {
      return LY_ENOTFOUND;
    }
    pcVar9 = lyd_get_value(node);
    if (node->schema == (lysc_node *)0x0) {
      plVar6 = (lys_module *)&node[2].schema;
    }
    else {
      plVar6 = node->schema->module;
    }
    ctx_00 = plVar6->ctx;
    sVar10 = strlen(pcVar9);
    LVar4 = LY_SUCCESS;
    LVar5 = lyd_value_validate(ctx_00,schema,pcVar9,sVar10,(lyd_node *)0x0,(lysc_type **)0x0,
                               (char **)0x0);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
  }
  lVar12 = 0;
  plVar14 = (lysc_pattern *)0x0;
  do {
    if (patterns == (lysc_pattern **)0x0) {
LAB_00160fd7:
      if (err != (ly_err_item *)0x0 && LVar4 != LY_SUCCESS) {
        ly_err_print(ctx,err);
        ly_err_free(err);
        ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Invalid \"eventTime\" in the notification.");
      }
      return LVar4;
    }
    if (patterns[-1] <= plVar14) {
      free(patterns + -1);
      goto LAB_00160fd7;
    }
    lysc_pattern_free(&cctx.free_ctx,(lysc_pattern **)((long)patterns + lVar12));
    plVar14 = (lysc_pattern *)((long)&plVar14->expr + 1);
    lVar12 = lVar12 + 8;
  } while( true );
}

Assistant:

LY_ERR
lyd_parser_notif_eventtime_validate(const struct lyd_node *node)
{
    LY_ERR rc = LY_SUCCESS;
    struct ly_ctx *ctx = (struct ly_ctx *)LYD_CTX(node);
    struct lysc_ctx cctx = {0};
    const struct lys_module *mod1, *mod2;
    const struct lysc_node *schema;
    LY_ARRAY_COUNT_TYPE u;
    struct ly_err_item *err = NULL;
    struct lysp_type *type_p = NULL;
    struct lysc_pattern **patterns = NULL;
    const char *value;

    /* find the used modules, we will either use a compiled leaf or compile the relevant type ourselves */
    mod1 = ly_ctx_get_module_implemented(ctx, "notifications");
    mod2 = ly_ctx_get_module_latest(ctx, "ietf-yang-types");
    assert(mod2);

    if (mod1 || !mod2->parsed) {
        /* get date-and-time leaf */
        schema = lys_find_path(LYD_CTX(node), NULL, "/notifications:notification/eventTime", 0);
        LY_CHECK_RET(!schema, LY_ENOTFOUND);

        /* validate the value */
        value = lyd_get_value(node);
        LY_CHECK_RET(lyd_value_validate(LYD_CTX(node), schema, value, strlen(value), NULL, NULL, NULL));
    } else {
        LYSC_CTX_INIT_CTX(cctx, ctx);

        /* get date-and-time parsed type */
        LY_ARRAY_FOR(mod2->parsed->typedefs, u) {
            if (!strcmp(mod2->parsed->typedefs[u].name, "date-and-time")) {
                type_p = &mod2->parsed->typedefs[u].type;
                break;
            }
        }
        assert(type_p);

        /* compile patterns */
        assert(type_p->patterns);
        LY_CHECK_GOTO(rc = lys_compile_type_patterns(&cctx, type_p->patterns, NULL, &patterns), cleanup);

        /* validate */
        value = lyd_get_value(node);
        rc = lyplg_type_validate_patterns(patterns, value, strlen(value), &err);
    }

cleanup:
    FREE_ARRAY(&cctx.free_ctx, patterns, lysc_pattern_free);
    if (rc && err) {
        ly_err_print(ctx, err);
        ly_err_free(err);
        LOGVAL(ctx, LYVE_DATA, "Invalid \"eventTime\" in the notification.");
    }
    return rc;
}